

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cxx
# Opt level: O1

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Argument *pAVar2;
  ostream *poVar3;
  string_view arg_name;
  string_view arg_name_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> addr;
  ArgumentParser program;
  server_t s;
  string local_600;
  long *local_5e0 [2];
  long local_5d0 [2];
  long *local_5c0 [2];
  long local_5b0 [2];
  string local_5a0;
  string local_580;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_560;
  long *local_540 [2];
  long local_530 [2];
  long *local_520 [2];
  long local_510 [2];
  ArgumentParser local_500;
  server_t local_318;
  
  local_580._M_dataplus._M_p = (pointer)&local_580.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_580,"file","");
  local_5a0._M_dataplus._M_p = (pointer)&local_5a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a0,"devel","");
  argparse::ArgumentParser::ArgumentParser
            (&local_500,&local_580,&local_5a0,all,true,(ostream *)&std::cout);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a0._M_dataplus._M_p != &local_5a0.field_2) {
    operator_delete(local_5a0._M_dataplus._M_p,local_5a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580._M_dataplus._M_p != &local_580.field_2) {
    operator_delete(local_580._M_dataplus._M_p,local_580.field_2._M_allocated_capacity + 1);
  }
  pAVar2 = argparse::ArgumentParser::add_argument<char_const*>(&local_500,"-dir");
  pAVar2 = argparse::Argument::default_value(pAVar2,"./public");
  local_5c0[0] = local_5b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5c0,"public directory","");
  std::__cxx11::string::operator=((string *)&pAVar2->m_help,(string *)local_5c0);
  local_520[0] = local_510;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_520,"PUBLIC_DIR","");
  std::__cxx11::string::operator=((string *)&pAVar2->m_metavar,(string *)local_520);
  (pAVar2->m_num_args_range).m_min = 1;
  (pAVar2->m_num_args_range).m_max = 1;
  if (local_520[0] != local_510) {
    operator_delete(local_520[0],local_510[0] + 1);
  }
  if (local_5c0[0] != local_5b0) {
    operator_delete(local_5c0[0],local_5b0[0] + 1);
  }
  pAVar2 = argparse::ArgumentParser::add_argument<char_const*>(&local_500,"-addr");
  pAVar2 = argparse::Argument::default_value(pAVar2,"0.0.0.0:8080");
  local_5e0[0] = local_5d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5e0,"server address","");
  std::__cxx11::string::operator=((string *)&pAVar2->m_help,(string *)local_5e0);
  local_540[0] = local_530;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"ADDR","");
  std::__cxx11::string::operator=((string *)&pAVar2->m_metavar,(string *)local_540);
  (pAVar2->m_num_args_range).m_min = 1;
  (pAVar2->m_num_args_range).m_max = 1;
  if (local_540[0] != local_530) {
    operator_delete(local_540[0],local_530[0] + 1);
  }
  if (local_5e0[0] != local_5d0) {
    operator_delete(local_5e0[0],local_5d0[0] + 1);
  }
  argparse::ArgumentParser::parse_args(&local_500,argc,argv);
  clask::server_t::server_t(&local_318);
  clask::logger::default_level = 2;
  paVar1 = &local_600.field_2;
  local_600._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_600,"/","");
  arg_name._M_str = "-dir";
  arg_name._M_len = 4;
  argparse::ArgumentParser::get<std::__cxx11::string>(&local_560,&local_500,arg_name);
  clask::server_t::static_dir(&local_318,&local_600,&local_560,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_560._M_dataplus._M_p != &local_560.field_2) {
    operator_delete(local_560._M_dataplus._M_p,local_560.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_600._M_dataplus._M_p != paVar1) {
    operator_delete(local_600._M_dataplus._M_p,local_600.field_2._M_allocated_capacity + 1);
  }
  arg_name_00._M_str = "-addr";
  arg_name_00._M_len = 5;
  argparse::ArgumentParser::get<std::__cxx11::string>(&local_600,&local_500,arg_name_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"started ",8);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,local_600._M_dataplus._M_p,local_600._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  clask::server_t::run(&local_318,&local_600);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_600._M_dataplus._M_p != paVar1) {
    operator_delete(local_600._M_dataplus._M_p,local_600.field_2._M_allocated_capacity + 1);
  }
  clask::server_t::~server_t(&local_318);
  argparse::ArgumentParser::~ArgumentParser(&local_500);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
  argparse::ArgumentParser program("file", CLASK_VERSION);
  program.add_argument("-dir")
      .default_value("./public")
      .help("public directory")
      .metavar("PUBLIC_DIR")
      .nargs(1);
  program.add_argument("-addr")
      .default_value("0.0.0.0:8080")
      .help("server address")
      .metavar("ADDR")
      .nargs(1);
  program.parse_args(argc, argv);

  auto s = clask::server();
  s.log.default_level = clask::log_level::INFO;
  s.static_dir("/", program.get<std::string>("-dir"));

  auto addr = program.get<std::string>("-addr");
  std::cerr << "started " << addr << std::endl;
  s.run(addr);
}